

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                *m1,Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                    *m2)

{
  undefined8 uVar1;
  uint cellIndex;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  lazy_ostream *plVar7;
  undefined4 local_608;
  Index local_604;
  basic_cstring<const_char> local_600;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5f0;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  Insertion_return local_5a8;
  undefined4 local_590;
  Index local_58c;
  basic_cstring<const_char> local_588;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_578;
  basic_cstring<const_char> local_550;
  basic_cstring<const_char> local_540;
  Insertion_return local_530;
  undefined4 local_518;
  Index local_514;
  basic_cstring<const_char> local_510;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_500;
  basic_cstring<const_char> local_4d8;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  basic_cstring<const_char> local_4a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_498;
  assertion_result local_478;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_420;
  assertion_result local_400;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3a8;
  assertion_result local_388;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_330;
  assertion_result local_310;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b8;
  assertion_result local_298;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1c8;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  undefined1 local_f8 [8];
  value_type boundary1;
  value_type boundary2;
  basic_cstring<const_char> local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78 [2];
  Insertion_return local_58;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  anon_class_1_0_00000001 test;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  *m2_local;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  *m1_local;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>>
            ();
  for (local_3c = 0; uVar4 = (ulong)local_3c,
      sVar5 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_38), cellIndex = local_3c, uVar4 < sVar5; local_3c = local_3c + 1) {
    pvVar6 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_38,(ulong)local_3c);
    iVar3 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::get_null_value<int>();
    Gudhi::persistence_matrix::
    Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
    ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (&local_58,
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
                *)m1,cellIndex,pvVar6,iVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_78,0x220,&local_88);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b0,plVar7,(char (*) [1])0x25f234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         Gudhi::persistence_matrix::
         Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
         ::get_number_of_columns(m1);
    boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_b0,&local_c0,0x220,1,2,
               (undefined1 *)
               ((long)&boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               "m1.get_number_of_columns()",
               &boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
  ::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&orderedBoundaries.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),m1);
  pvVar6 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_38);
  pvVar6 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,pvVar6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_38);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0x228,&local_118);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_entry(m2,1,2);
    boost::test_tools::assertion_result::assertion_result(&local_130,bVar2);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,"m2.is_zero_entry(1, 2)",0x16);
    boost::unit_test::operator<<(&local_150,plVar7,&local_160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_150,&local_170,0x228,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_180,0x229,&local_190);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_entry(m2,1,1);
    boost::test_tools::assertion_result::assertion_result(&local_1a8,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,"!m2.is_zero_entry(1, 1)",0x17);
    boost::unit_test::operator<<(&local_1c8,plVar7,&local_1d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_1c8,&local_1e8,0x229,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1c8);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x22a,&local_208);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_entry(m2,3,3);
    boost::test_tools::assertion_result::assertion_result(&local_220,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,"!m2.is_zero_entry(3, 3)",0x17);
    boost::unit_test::operator<<(&local_240,plVar7,&local_250);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&local_260,0x22a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_240);
    boost::test_tools::assertion_result::~assertion_result(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_280);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_270,0x22b,&local_280);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_column(m2,0);
    boost::test_tools::assertion_result::assertion_result(&local_298,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,"!m2.is_zero_column(0)",0x15);
    boost::unit_test::operator<<(&local_2b8,plVar7,&local_2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_298,&local_2b8,&local_2d8,0x22b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2b8);
    boost::test_tools::assertion_result::~assertion_result(&local_298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e8,0x22c,&local_2f8);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_column(m2,1);
    boost::test_tools::assertion_result::assertion_result(&local_310,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,"!m2.is_zero_column(1)",0x15);
    boost::unit_test::operator<<(&local_330,plVar7,&local_340);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_310,&local_330,&local_350,0x22c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_330);
    boost::test_tools::assertion_result::~assertion_result(&local_310);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_370);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_360,0x22d,&local_370);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_column(m2,2);
    boost::test_tools::assertion_result::assertion_result(&local_388,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,"!m2.is_zero_column(2)",0x15);
    boost::unit_test::operator<<(&local_3a8,plVar7,&local_3b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_388,&local_3a8,&local_3c8,0x22d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3a8);
    boost::test_tools::assertion_result::~assertion_result(&local_388);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d8,0x22e,&local_3e8);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_column(m2,3);
    boost::test_tools::assertion_result::assertion_result(&local_400,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,"!m2.is_zero_column(3)",0x15);
    boost::unit_test::operator<<(&local_420,plVar7,&local_430);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_400,&local_420,&local_440,0x22e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_420);
    boost::test_tools::assertion_result::~assertion_result(&local_400);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_460);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x22f,&local_460);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
            ::is_zero_column(m2,4);
    boost::test_tools::assertion_result::assertion_result(&local_478,(bool)(~bVar2 & 1));
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,"!m2.is_zero_column(4)",0x15);
    boost::unit_test::operator<<(&local_498,plVar7,&local_4a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_478,&local_498,&local_4b8,0x22f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_498);
    boost::test_tools::assertion_result::~assertion_result(&local_478);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4c8,0x231,&local_4d8);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_500,plVar7,(char (*) [1])0x25f234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_514 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                ::get_number_of_columns(m2);
    local_518 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_500,&local_510,0x231,1,2,&local_514,"m2.get_number_of_columns()",&local_518,
               "5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_500);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  iVar3 = Gudhi::persistence_matrix::
          Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
  ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&local_530,
             (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
              *)m2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_530);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_550);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_540,0x233,&local_550);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_578,plVar7,(char (*) [1])0x25f234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_58c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                ::get_number_of_columns(m2);
    local_590 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_578,&local_588,0x233,1,2,&local_58c,"m2.get_number_of_columns()",&local_590,
               "6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_578);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  iVar3 = Gudhi::persistence_matrix::
          Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
  ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&local_5a8,
             (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
              *)m2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b8,0x235,&local_5c8);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5f0,plVar7,(char (*) [1])0x25f234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_604 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                ::get_number_of_columns(m2);
    local_608 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_5f0,&local_600,0x235,1,2,&local_604,"m2.get_number_of_columns()",&local_608,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
  ::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&orderedBoundaries.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),m2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_38);
  return;
}

Assistant:

void test_chain_boundary_insertion(Matrix& m1, Matrix& m2) {
  auto test = [](Matrix& m) {
    BOOST_CHECK(m.is_zero_entry(1, 2));
    BOOST_CHECK(!m.is_zero_entry(1, 1));
    BOOST_CHECK(!m.is_zero_entry(3, 3));
    BOOST_CHECK(!m.is_zero_column(0));
    BOOST_CHECK(!m.is_zero_column(1));
    BOOST_CHECK(!m.is_zero_column(2));
    BOOST_CHECK(!m.is_zero_column(3));
    BOOST_CHECK(!m.is_zero_column(4));
    BOOST_CHECK(!m.is_zero_column(5));
    BOOST_CHECK(!m.is_zero_column(6));

    BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

    BOOST_CHECK_EQUAL(m.get_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_pivot(6), 6);

    BOOST_CHECK_EQUAL(m.get_column_with_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(6), 6);
  };

  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_indexed_by_position<Matrix>())
      m1.insert_boundary(orderedBoundaries[i]);
    else
      m1.insert_boundary(i, orderedBoundaries[i]);
  }
  BOOST_CHECK_EQUAL(m1.get_number_of_columns(), 7);
  test(m1);

  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  BOOST_CHECK(m2.is_zero_entry(1, 2));
  BOOST_CHECK(!m2.is_zero_entry(1, 1));
  BOOST_CHECK(!m2.is_zero_entry(3, 3));
  BOOST_CHECK(!m2.is_zero_column(0));
  BOOST_CHECK(!m2.is_zero_column(1));
  BOOST_CHECK(!m2.is_zero_column(2));
  BOOST_CHECK(!m2.is_zero_column(3));
  BOOST_CHECK(!m2.is_zero_column(4));

  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 5);
  m2.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 6);
  m2.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 7);
  test(m2);
}